

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

void __thiscall
libtorrent::mmap_disk_io::add_completed_jobs_impl
          (mmap_disk_io *this,jobqueue_t *jobs,jobqueue_t *completed)

{
  counters *this_00;
  io_context *ioc;
  bool bVar1;
  job_action_t jVar2;
  int iVar3;
  disk_job *pdVar4;
  element_type *peVar5;
  tailqueue<libtorrent::aux::disk_job> local_d8;
  lock_guard<std::mutex> local_c0;
  lock_guard<std::mutex> l_1;
  tailqueue<libtorrent::aux::disk_job> local_a8;
  lock_guard<std::mutex> local_90;
  lock_guard<std::mutex> l;
  storage_error local_78;
  disk_job *local_60;
  mmap_disk_job *j_1;
  disk_job *local_50;
  mmap_disk_job *j;
  tailqueue_iterator<libtorrent::aux::disk_job> i;
  undefined1 local_38 [4];
  int ret;
  jobqueue_t new_jobs;
  jobqueue_t *completed_local;
  jobqueue_t *jobs_local;
  mmap_disk_io *this_local;
  
  new_jobs._16_8_ = completed;
  libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
            ((tailqueue<libtorrent::aux::disk_job> *)local_38);
  i.m_current._4_4_ = 0;
  j = (mmap_disk_job *)libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::iterate(jobs);
  while (pdVar4 = libtorrent::aux::tailqueue_iterator<libtorrent::aux::disk_job>::get
                            ((tailqueue_iterator<libtorrent::aux::disk_job> *)&j),
        pdVar4 != (disk_job *)0x0) {
    local_50 = libtorrent::aux::tailqueue_iterator<libtorrent::aux::disk_job>::get
                         ((tailqueue_iterator<libtorrent::aux::disk_job> *)&j);
    j_1._6_1_ = (local_50->flags).m_val;
    j_1._5_1_ = 2;
    j_1._7_1_ = libtorrent::flags::operator&
                          (j_1._6_1_,
                           (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                      ((bitfield_flag *)((long)&j_1 + 7));
    if (bVar1) {
      this_00 = this->m_stats_counters;
      jVar2 = libtorrent::aux::disk_job::get_type(local_50);
      counters::inc_stats_counter(this_00,jVar2 + 0xfe,-1);
    }
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_50 + 1));
    if (bVar1) {
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(local_50 + 1));
      iVar3 = libtorrent::aux::disk_job_fence::job_complete
                        (&peVar5->super_disk_job_fence,local_50,
                         (tailqueue<libtorrent::aux::disk_job> *)local_38);
      i.m_current._4_4_ = iVar3 + i.m_current._4_4_;
    }
    libtorrent::aux::tailqueue_iterator<libtorrent::aux::disk_job>::next
              ((tailqueue_iterator<libtorrent::aux::disk_job> *)&j);
  }
  counters::inc_stats_counter(this->m_stats_counters,0xfb,(long)-i.m_current._4_4_);
  bVar1 = ::std::atomic<bool>::load(&this->m_abort,memory_order_seq_cst);
  if (bVar1) {
    while (bVar1 = libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::empty
                             ((tailqueue<libtorrent::aux::disk_job> *)local_38),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::pop_front
                           ((tailqueue<libtorrent::aux::disk_job> *)local_38);
      (local_60->ret).m_val = '\x01';
      boost::system::error_code::error_code<boost::asio::error::basic_errors>
                ((error_code *)&l,operation_aborted,(type *)0x0);
      storage_error::storage_error(&local_78,_l);
      (local_60->error).ec.val_ = local_78.ec.val_;
      (local_60->error).ec.failed_ = local_78.ec.failed_;
      *(undefined3 *)&(local_60->error).ec.field_0x5 = local_78.ec._5_3_;
      (local_60->error).ec.cat_ = local_78.ec.cat_;
      *(undefined3 *)&(local_60->error).field_0x10 = local_78._16_3_;
      (local_60->error).operation = local_78.operation;
      libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::push_back
                ((tailqueue<libtorrent::aux::disk_job> *)new_jobs._16_8_,local_60);
    }
  }
  else {
    bVar1 = libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::empty
                      ((tailqueue<libtorrent::aux::disk_job> *)local_38);
    if (!bVar1) {
      ::std::lock_guard<std::mutex>::lock_guard(&local_90,&this->m_job_mutex);
      libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
                (&local_a8,(tailqueue<libtorrent::aux::disk_job> *)local_38);
      libtorrent::aux::disk_io_thread_pool::append(&this->m_generic_threads,&local_a8);
      ::std::lock_guard<std::mutex>::~lock_guard(&local_90);
      ::std::lock_guard<std::mutex>::lock_guard(&local_c0,&this->m_job_mutex);
      libtorrent::aux::disk_io_thread_pool::submit_jobs(&this->m_generic_threads);
      ::std::lock_guard<std::mutex>::~lock_guard(&local_c0);
    }
  }
  ioc = this->m_ios;
  libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue(&local_d8,jobs);
  libtorrent::aux::disk_completed_queue::append(&this->m_completed_jobs,ioc,&local_d8);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs_impl(jobqueue_t jobs, jobqueue_t& completed)
	{
		jobqueue_t new_jobs;
		int ret = 0;
		for (auto i = jobs.iterate(); i.get(); i.next())
		{
			auto* j = static_cast<aux::mmap_disk_job*>(i.get());
			TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);

			if (j->flags & aux::disk_job::fence)
			{
				m_stats_counters.inc_stats_counter(
					counters::num_fenced_read + static_cast<int>(j->get_type()), -1);
			}

			TORRENT_ASSERT(j->storage);
			if (j->storage)
				ret += j->storage->job_complete(j, new_jobs);

			TORRENT_ASSERT(ret == new_jobs.size());
			TORRENT_ASSERT(!(j->flags & aux::disk_job::in_progress));
#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(j->job_posted == false);
			j->job_posted = true;
#endif
		}

		if (ret)
		{
			DLOG("unblocked %d jobs (%d left)\n", ret
				, int(m_stats_counters[counters::blocked_disk_jobs]) - ret);
		}

		m_stats_counters.inc_stats_counter(counters::blocked_disk_jobs, -ret);
		TORRENT_ASSERT(int(m_stats_counters[counters::blocked_disk_jobs]) >= 0);

		if (m_abort.load())
		{
			while (!new_jobs.empty())
			{
				auto* j = static_cast<aux::mmap_disk_job*>(new_jobs.pop_front());
				TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);
				j->ret = disk_status::fatal_disk_error;
				j->error = storage_error(boost::asio::error::operation_aborted);
				completed.push_back(j);
			}
		}
		else
		{
			if (!new_jobs.empty())
			{
				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.append(std::move(new_jobs));
				}

				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.submit_jobs();
				}
			}
		}

		m_completed_jobs.append(m_ios, std::move(jobs));
	}